

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SHA1_Hash * __thiscall
ON_SubDimple::EdgeHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDimple *this,ON_SubDHashType hash_type)

{
  ON_SubDLevel *pOVar1;
  uint level_index;
  ON_SubDLevel *pOVar2;
  ON_SubDEdgeIdIterator eidit;
  ON_SubDEdgeIdIterator local_50;
  
  ON_FixedSizePoolIterator::ON_FixedSizePoolIterator(&local_50.super_ON_FixedSizePoolIterator);
  ON_SubDRef::ON_SubDRef(&local_50.m_subd_ref);
  InitializeEdgeIdIterator(this,&local_50);
  pOVar1 = this->m_active_level;
  level_index = 0;
  pOVar2 = pOVar1;
  if (pOVar1 == (ON_SubDLevel *)0x0) {
    pOVar2 = &ON_SubDLevel::Empty;
  }
  if (pOVar1 != (ON_SubDLevel *)0x0) {
    level_index = pOVar1->m_level_index;
  }
  Internal_EdgeHash(__return_storage_ptr__,hash_type,pOVar2->m_edge[0],level_index,&local_50);
  ON_SubDRef::~ON_SubDRef(&local_50.m_subd_ref);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDimple::EdgeHash(ON_SubDHashType hash_type) const
{
  ON_SubDEdgeIdIterator eidit;
  this->InitializeEdgeIdIterator(eidit);
  return Internal_EdgeHash(hash_type, ActiveLevel().m_edge[0], this->ActiveLevelIndex(), eidit);
}